

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Dropout_x86_avx::forward_inplace(Dropout_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  void *pvVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  float *pfVar17;
  uint uVar18;
  float fVar19;
  float fVar21;
  float fVar22;
  undefined1 auVar20 [16];
  float fVar23;
  
  fVar19 = (this->super_Dropout).scale;
  if (fVar19 != 1.0) {
    iVar14 = bottom_top_blob->dims;
    auVar20 = ZEXT416((uint)fVar19);
    if (bottom_top_blob->elempack == 4) {
      uVar11 = bottom_top_blob->w;
      uVar2 = bottom_top_blob->h;
      uVar18 = bottom_top_blob->c;
      auVar20 = vshufps_avx(auVar20,auVar20,0);
      fVar19 = auVar20._0_4_;
      fVar21 = auVar20._4_4_;
      fVar22 = auVar20._8_4_;
      fVar23 = auVar20._12_4_;
      if (iVar14 == 3) {
        if (0 < (int)uVar18) {
          uVar15 = 1;
          if (1 < (int)uVar18) {
            uVar15 = (ulong)uVar18;
          }
          uVar13 = 0;
          do {
            if (0 < (int)(uVar2 * uVar11)) {
              pfVar17 = (float *)(bottom_top_blob->cstep * uVar13 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar14 = uVar2 * uVar11;
              do {
                *pfVar17 = fVar19 * *pfVar17;
                pfVar17[1] = fVar21 * pfVar17[1];
                pfVar17[2] = fVar22 * pfVar17[2];
                pfVar17[3] = fVar23 * pfVar17[3];
                pfVar17 = pfVar17 + 4;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar15);
        }
      }
      else if (iVar14 == 2) {
        if (0 < (int)uVar2) {
          uVar15 = 0;
          do {
            if (0 < (int)uVar11) {
              pfVar17 = (float *)((long)bottom_top_blob->w * uVar15 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar13 = (ulong)uVar11;
              do {
                *pfVar17 = fVar19 * *pfVar17;
                pfVar17[1] = fVar21 * pfVar17[1];
                pfVar17[2] = fVar22 * pfVar17[2];
                pfVar17[3] = fVar23 * pfVar17[3];
                pfVar17 = pfVar17 + 4;
                uVar18 = (int)uVar13 - 1;
                uVar13 = (ulong)uVar18;
              } while (uVar18 != 0);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar2);
        }
      }
      else if ((iVar14 == 1) && (0 < (int)uVar11)) {
        lVar16 = 0;
        do {
          pfVar17 = (float *)((long)bottom_top_blob->data + lVar16);
          fVar5 = pfVar17[1];
          fVar6 = pfVar17[2];
          fVar7 = pfVar17[3];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar16);
          *pfVar1 = fVar19 * *pfVar17;
          pfVar1[1] = fVar21 * fVar5;
          pfVar1[2] = fVar22 * fVar6;
          pfVar1[3] = fVar23 * fVar7;
          lVar16 = lVar16 + 0x10;
        } while ((ulong)uVar11 << 4 != lVar16);
      }
    }
    else {
      if (bottom_top_blob->elempack != 8) {
        if (((this->super_Dropout).scale != 1.0) && (iVar14 = bottom_top_blob->c, 0 < (long)iVar14))
        {
          uVar11 = bottom_top_blob->h * bottom_top_blob->w;
          pvVar12 = bottom_top_blob->data;
          sVar3 = bottom_top_blob->cstep;
          sVar4 = bottom_top_blob->elemsize;
          lVar16 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar15 = 0;
              do {
                *(float *)((long)pvVar12 + uVar15 * 4) =
                     (this->super_Dropout).scale * *(float *)((long)pvVar12 + uVar15 * 4);
                uVar15 = uVar15 + 1;
              } while (uVar11 != uVar15);
            }
            lVar16 = lVar16 + 1;
            pvVar12 = (void *)((long)pvVar12 + sVar3 * sVar4);
          } while (lVar16 != iVar14);
        }
        return 0;
      }
      uVar11 = bottom_top_blob->w;
      uVar2 = bottom_top_blob->h;
      uVar18 = bottom_top_blob->c;
      auVar20 = vshufps_avx(auVar20,auVar20,0);
      fVar19 = auVar20._0_4_;
      fVar21 = auVar20._4_4_;
      fVar22 = auVar20._8_4_;
      fVar23 = auVar20._12_4_;
      if (iVar14 == 3) {
        if (0 < (int)uVar18) {
          uVar15 = 1;
          if (1 < (int)uVar18) {
            uVar15 = (ulong)uVar18;
          }
          uVar13 = 0;
          do {
            if (0 < (int)(uVar2 * uVar11)) {
              pfVar17 = (float *)(bottom_top_blob->cstep * uVar13 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              iVar14 = uVar2 * uVar11;
              do {
                *pfVar17 = fVar19 * *pfVar17;
                pfVar17[1] = fVar21 * pfVar17[1];
                pfVar17[2] = fVar22 * pfVar17[2];
                pfVar17[3] = fVar23 * pfVar17[3];
                pfVar17[4] = fVar19 * pfVar17[4];
                pfVar17[5] = fVar21 * pfVar17[5];
                pfVar17[6] = fVar22 * pfVar17[6];
                pfVar17[7] = 0.0;
                pfVar17 = pfVar17 + 8;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar15);
        }
      }
      else if (iVar14 == 2) {
        if (0 < (int)uVar2) {
          uVar15 = 0;
          do {
            if (0 < (int)uVar11) {
              pfVar17 = (float *)((long)bottom_top_blob->w * uVar15 * bottom_top_blob->elemsize +
                                 (long)bottom_top_blob->data);
              uVar13 = (ulong)uVar11;
              do {
                *pfVar17 = fVar19 * *pfVar17;
                pfVar17[1] = fVar21 * pfVar17[1];
                pfVar17[2] = fVar22 * pfVar17[2];
                pfVar17[3] = fVar23 * pfVar17[3];
                pfVar17[4] = fVar19 * pfVar17[4];
                pfVar17[5] = fVar21 * pfVar17[5];
                pfVar17[6] = fVar22 * pfVar17[6];
                pfVar17[7] = 0.0;
                pfVar17 = pfVar17 + 8;
                uVar18 = (int)uVar13 - 1;
                uVar13 = (ulong)uVar18;
              } while (uVar18 != 0);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar2);
        }
      }
      else if ((iVar14 == 1) && (0 < (int)uVar11)) {
        lVar16 = 0;
        do {
          pfVar17 = (float *)((long)bottom_top_blob->data + lVar16);
          fVar5 = pfVar17[1];
          fVar6 = pfVar17[2];
          fVar7 = pfVar17[3];
          fVar8 = pfVar17[4];
          fVar9 = pfVar17[5];
          fVar10 = pfVar17[6];
          pfVar1 = (float *)((long)bottom_top_blob->data + lVar16);
          *pfVar1 = fVar19 * *pfVar17;
          pfVar1[1] = fVar21 * fVar5;
          pfVar1[2] = fVar22 * fVar6;
          pfVar1[3] = fVar23 * fVar7;
          pfVar1[4] = fVar19 * fVar8;
          pfVar1[5] = fVar21 * fVar9;
          pfVar1[6] = fVar22 * fVar10;
          pfVar1[7] = 0.0;
          lVar16 = lVar16 + 0x20;
        } while ((ulong)uVar11 << 5 != lVar16);
      }
    }
  }
  return 0;
}

Assistant:

int Dropout_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

#if __SSE2__
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m256 _scale = _mm256_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _scale);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _scale);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        __m128 _scale = _mm_set1_ps(scale);

        if (dims == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;
                __m128 _p = _mm_loadu_ps(ptr);
                _p = _mm_mul_ps(_p, _scale);
                _mm_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_mul_ps(_p, _scale);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    return Dropout::forward_inplace(bottom_top_blob, opt);
}